

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset_wire_format.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_wireformat_unittest::TestMessageSet::_InternalSerialize
          (TestMessageSet *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestMessageSet *extendee;
  uint8_t *puVar1;
  UnknownFieldSet *unknown_fields;
  TestMessageSet *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestMessageSet *this_local;
  
  extendee = default_instance();
  puVar1 = google::protobuf::internal::ExtensionSet::
           InternalSerializeMessageSetWithCachedSizesToArray
                     (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,target,stream);
  unknown_fields =
       google::protobuf::internal::InternalMetadata::
       unknown_fields<google::protobuf::UnknownFieldSet>
                 (&(this->super_Message).super_MessageLite._internal_metadata_,
                  google::protobuf::UnknownFieldSet::default_instance);
  puVar1 = google::protobuf::internal::InternalSerializeUnknownMessageSetItemsToArray
                     (unknown_fields,puVar1,stream);
  return puVar1;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMessageSet::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMessageSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
   target =
      this_._impl_._extensions_
          .InternalSerializeMessageSetWithCachedSizesToArray(
              &default_instance(), target, stream);
  target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(
      this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  return target;
}